

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O2

QByteArray * __thiscall
QHttpNetworkRequest::methodName(QByteArray *__return_storage_ptr__,QHttpNetworkRequest *this)

{
  QHttpNetworkRequestPrivate *pQVar1;
  char *pcVar2;
  
  pQVar1 = (this->d).d.ptr;
  switch(pQVar1->operation) {
  case Options:
    pcVar2 = "OPTIONS";
    break;
  case Get:
    pcVar2 = "GET";
    break;
  case Head:
    pcVar2 = "HEAD";
    break;
  case Post:
    pcVar2 = "POST";
    break;
  case Put:
    pcVar2 = "PUT";
    break;
  case Delete:
    pcVar2 = "DELETE";
    break;
  case Trace:
    pcVar2 = "TRACE";
    break;
  case Connect:
    pcVar2 = "CONNECT";
    break;
  case Custom:
    QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,&(pQVar1->customVerb).d);
    return __return_storage_ptr__;
  default:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
  QByteArray::QByteArray(__return_storage_ptr__,pcVar2,-1);
  return __return_storage_ptr__;
}

Assistant:

QByteArray QHttpNetworkRequest::methodName() const
{
    switch (d->operation) {
    case QHttpNetworkRequest::Get:
        return "GET";
    case QHttpNetworkRequest::Head:
        return "HEAD";
    case QHttpNetworkRequest::Post:
        return "POST";
    case QHttpNetworkRequest::Options:
        return "OPTIONS";
    case QHttpNetworkRequest::Put:
        return "PUT";
    case QHttpNetworkRequest::Delete:
        return "DELETE";
    case QHttpNetworkRequest::Trace:
        return "TRACE";
    case QHttpNetworkRequest::Connect:
        return "CONNECT";
    case QHttpNetworkRequest::Custom:
        return d->customVerb;
    default:
        break;
    }
    return QByteArray();
}